

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hpp
# Opt level: O0

Variant * __thiscall Variant::operator=(Variant *this,Variant *other)

{
  Data *pDVar1;
  data dVar2;
  undefined4 uVar3;
  Variant *other_local;
  Variant *this_local;
  
  if (other != this) {
    if (other->data->ref == 0) {
      clear(this);
      this->data = &this->_data;
      pDVar1 = other->data;
      (this->_data).ref = pDVar1->ref;
      uVar3 = *(undefined4 *)&pDVar1->field_0x4;
      dVar2 = pDVar1->data;
      (this->_data).type = pDVar1->type;
      *(undefined4 *)&(this->_data).field_0x4 = uVar3;
      (this->_data).data = dVar2;
    }
    else {
      Atomic::increment(&other->data->ref);
      clear(this);
      this->data = other->data;
    }
  }
  return this;
}

Assistant:

Variant& operator=(const Variant& other)
  {
    if(&other != this)
    {
      if(other.data->ref)
      {
        Atomic::increment(other.data->ref);
        clear();
        data = other.data;
      }
      else //if(&other != this)
      {
        clear();
        data = &_data;
        _data = *other.data;
      }
    }
    return *this;
  }